

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
I2sSimulationDataGenerator::Initialize
          (I2sSimulationDataGenerator *this,U32 simulation_sample_rate,I2sAnalyzerSettings *settings
          )

{
  SimulationChannelDescriptorGroup *pSVar1;
  vector<BitState,_std::allocator<BitState>_> *this_00;
  U32 UVar2;
  PcmFrameType PVar3;
  SimulationChannelDescriptor *pSVar4;
  S64 SVar5;
  U32 i;
  U32 UVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  U64 mask;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  pSVar1 = &this->mSimulationChannels;
  pSVar4 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)settings + 0x10,simulation_sample_rate);
  this->mClock = pSVar4;
  pSVar4 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)this->mSettings + 0x20,this->mSimulationSampleRateHz);
  this->mFrame = pSVar4;
  pSVar4 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)this->mSettings + 0x30,this->mSimulationSampleRateHz);
  this->mData = pSVar4;
  InitSineWave(this);
  ClockGenerator::Init
            ((double)(this->mNumPaddingBits + this->mSettings->mBitsPerWord) *
             (this->mAudioSampleRate + this->mAudioSampleRate),(int)this + 0x60);
  this->mCurrentAudioWordIndex = 0;
  this->mCurrentAudioChannel = Left;
  this->mPaddingCount = 0;
  UVar2 = this->mSettings->mBitsPerWord;
  if (this->mSettings->mShiftOrder == MsbFirst) {
    mask = 1L << ((char)UVar2 - 1U & 0x3f);
    UVar6 = UVar2;
    while (bVar11 = UVar6 != 0, UVar6 = UVar6 - 1, bVar11) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mBitMasks,&mask);
      mask = mask >> 1;
    }
  }
  else {
    mask = 1;
    UVar6 = UVar2;
    while (bVar11 = UVar6 != 0, UVar6 = UVar6 - 1, bVar11) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mBitMasks,&mask);
      mask = mask << 1;
    }
  }
  uVar9 = UVar2 + this->mNumPaddingBits;
  PVar3 = this->mSettings->mFrameType;
  if (PVar3 == FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS) {
    if (this->mUseShortFrames == false) {
      iVar10 = uVar9 * 2;
      iVar8 = iVar10;
      while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
        mask = CONCAT44(mask._4_4_,1);
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (&this->mFrameBits,(BitState *)&mask);
      }
      while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
        mask = mask & 0xffffffff00000000;
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (&this->mFrameBits,(BitState *)&mask);
      }
    }
    else {
      mask = CONCAT44(mask._4_4_,1);
      std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                (&this->mFrameBits,(BitState *)&mask);
      for (uVar7 = 1; uVar7 < uVar9 * 4; uVar7 = uVar7 + 1) {
        mask = mask & 0xffffffff00000000;
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (&this->mFrameBits,(BitState *)&mask);
      }
    }
  }
  else if (PVar3 == FRAME_TRANSITION_ONCE_EVERY_WORD) {
    this_00 = &this->mFrameBits;
    uVar7 = uVar9;
    if (this->mUseShortFrames == false) {
      while (uVar7 != 0) {
        mask = CONCAT44(mask._4_4_,1);
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (this_00,(BitState *)&mask);
        uVar7 = uVar7 - 1;
      }
      while (bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
        mask = mask & 0xffffffff00000000;
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (this_00,(BitState *)&mask);
      }
    }
    else {
      mask = CONCAT44(mask._4_4_,1);
      std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                (this_00,(BitState *)&mask);
      for (uVar7 = 1; uVar7 < uVar9 * 2; uVar7 = uVar7 + 1) {
        mask = mask & 0xffffffff00000000;
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (this_00,(BitState *)&mask);
      }
    }
  }
  else if (PVar3 == FRAME_TRANSITION_TWICE_EVERY_WORD) {
    if (this->mUseShortFrames == false) {
      uVar7 = uVar9 >> 1;
      while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
        mask = CONCAT44(mask._4_4_,1);
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (&this->mFrameBits,(BitState *)&mask);
      }
      iVar10 = uVar9 - (uVar9 >> 1);
      while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
        mask = mask & 0xffffffff00000000;
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (&this->mFrameBits,(BitState *)&mask);
      }
    }
    else {
      mask = CONCAT44(mask._4_4_,1);
      std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                (&this->mFrameBits,(BitState *)&mask);
      for (uVar7 = 1; uVar7 < uVar9; uVar7 = uVar7 + 1) {
        mask = mask & 0xffffffff00000000;
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (&this->mFrameBits,(BitState *)&mask);
      }
    }
  }
  else {
    AnalyzerHelpers::Assert("unexpected");
  }
  SVar5 = GetNextAudioWord(this);
  this->mCurrentWord = SVar5;
  this->mCurrentBitIndex = 0;
  this->mCurrentFrameBitIndex = 0;
  this->mBitGenerationState = Init;
  return;
}

Assistant:

void I2sSimulationDataGenerator::Initialize( U32 simulation_sample_rate, I2sAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    if( mSettings->mDataValidEdge == AnalyzerEnums::NegEdge )
        mClock = mSimulationChannels.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
    else
        mClock = mSimulationChannels.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );

    mFrame = mSimulationChannels.Add( mSettings->mFrameChannel, mSimulationSampleRateHz, BIT_LOW );
    mData = mSimulationChannels.Add( mSettings->mDataChannel, mSimulationSampleRateHz, BIT_LOW );

    InitSineWave();
    double bits_per_s = mAudioSampleRate * 2.0 * double( mSettings->mBitsPerWord + mNumPaddingBits );
    mClockGenerator.Init( bits_per_s, mSimulationSampleRateHz );

    mCurrentAudioWordIndex = 0;
    mCurrentAudioChannel = Left;
    mPaddingCount = 0;

    U64 audio_bit_depth = mSettings->mBitsPerWord;

    if( mSettings->mShiftOrder == AnalyzerEnums::MsbFirst )
    {
        U64 mask = 1ULL << ( audio_bit_depth - 1 );
        for( U32 i = 0; i < audio_bit_depth; i++ )
        {
            mBitMasks.push_back( mask );
            mask = mask >> 1;
        }
    }
    else
    {
        U64 mask = 1;
        for( U32 i = 0; i < audio_bit_depth; i++ )
        {
            mBitMasks.push_back( mask );
            mask = mask << 1;
        }
    }

    // enum PcmFrameType { FRAME_TRANSITION_TWICE_EVERY_WORD, FRAME_TRANSITION_ONCE_EVERY_WORD, FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS };
    U32 bits_per_word = audio_bit_depth + mNumPaddingBits;
    switch( mSettings->mFrameType )
    {
    case FRAME_TRANSITION_TWICE_EVERY_WORD:
        if( mUseShortFrames == false )
        {
            U32 high_count = bits_per_word / 2;
            U32 low_count = bits_per_word - high_count;
            for( U32 i = 0; i < high_count; i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < low_count; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    case FRAME_TRANSITION_ONCE_EVERY_WORD:
        if( mUseShortFrames == false )
        {
            for( U32 i = 0; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    case FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS:
        if( mUseShortFrames == false )
        {
            for( U32 i = 0; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < ( bits_per_word * 4 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    default:
        AnalyzerHelpers::Assert( "unexpected" );
        break;
    }

    mCurrentWord = GetNextAudioWord();
    mCurrentBitIndex = 0;
    mCurrentFrameBitIndex = 0;
    mBitGenerationState = Init;
}